

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteLoop<unsigned_short,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::VectorStringCastOperator<duckdb::IntCastToVarInt>>
               (unsigned_short *ldata,string_t *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  idx_t iVar2;
  undefined8 uVar3;
  ulong uVar4;
  char *pcVar5;
  idx_t iVar6;
  ulong uVar7;
  char **ppcVar8;
  string_t sVar9;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    ppcVar8 = &(result_data->value).pointer.ptr;
    pcVar5 = (char *)count;
    for (uVar7 = 0; count != uVar7; uVar7 = uVar7 + 1) {
      uVar4 = uVar7;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)sel_vector->sel_vector[uVar7];
      }
      sVar9 = IntToVarInt<unsigned_short>
                        ((duckdb *)dataptr,(Vector *)(ulong)ldata[uVar4],(unsigned_short)pcVar5);
      pcVar5 = sVar9.value._8_8_;
      iVar6 = sVar9.value._0_8_;
      paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar8 + -1);
      paVar1->length = (int)iVar6;
      paVar1->prefix[0] = (char)(iVar6 >> 0x20);
      paVar1->prefix[1] = (char)(iVar6 >> 0x28);
      paVar1->prefix[2] = (char)(iVar6 >> 0x30);
      paVar1->prefix[3] = (char)(iVar6 >> 0x38);
      *ppcVar8 = pcVar5;
      ppcVar8 = ppcVar8 + 2;
    }
  }
  else {
    ppcVar8 = &(result_data->value).pointer.ptr;
    for (iVar6 = 0; count != iVar6; iVar6 = iVar6 + 1) {
      iVar2 = iVar6;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        iVar2 = (idx_t)sel_vector->sel_vector[iVar6];
      }
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[iVar2 >> 6] >>
           (iVar2 & 0x3f) & 1) == 0) {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_mask->super_TemplatedValidityMask<unsigned_long>,iVar6);
      }
      else {
        sVar9 = IntToVarInt<unsigned_short>
                          ((duckdb *)dataptr,(Vector *)(ulong)ldata[iVar2],
                           (unsigned_short)(iVar2 >> 6));
        uVar3 = sVar9.value._0_8_;
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar8 + -1);
        paVar1->length = (int)uVar3;
        paVar1->prefix[0] = (char)((ulong)uVar3 >> 0x20);
        paVar1->prefix[1] = (char)((ulong)uVar3 >> 0x28);
        paVar1->prefix[2] = (char)((ulong)uVar3 >> 0x30);
        paVar1->prefix[3] = (char)((ulong)uVar3 >> 0x38);
        *ppcVar8 = sVar9.value._8_8_;
      }
      ppcVar8 = ppcVar8 + 2;
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}